

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

bool __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
::ExplicitProducer::
enqueue<(duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,duckdb::shared_ptr<duckdb::Task,true>>
          (ExplicitProducer *this,shared_ptr<duckdb::Task,_true> *element)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  Block *pBVar4;
  long lVar5;
  Block *pBVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  bool bVar9;
  ulong uVar10;
  Block *pBVar11;
  long lVar12;
  
  uVar2 = *(ulong *)(this + 0x20);
  if ((uVar2 & 0x1f) == 0) {
    if ((*(long *)(this + 0x40) == 0) ||
       (bVar9 = Block::
                is_empty<(duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
                          (*(Block **)(*(long *)(this + 0x40) + 0x200)), !bVar9)) {
      if (((0x7ffffffffffffffe < (*(long *)(this + 0x28) - uVar2) + 0x7fffffffffffffdf) ||
          (((*(long *)(this + 0x80) == 0 || (*(size_t *)(this + 0x60) == *(size_t *)(this + 0x68)))
           && (bVar9 = ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                       ::ExplicitProducer::new_block_index
                                 ((ExplicitProducer *)this,*(size_t *)(this + 0x60)), !bVar9)))) ||
         (pBVar11 = requisition_block<(duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                              (*(ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                                 **)(this + 0x50)), pBVar11 == (Block *)0x0)) {
        return false;
      }
      Block::
      reset_empty<(duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
                (pBVar11);
      pBVar4 = *(Block **)(this + 0x40);
      pBVar6 = pBVar11;
      if (pBVar4 != (Block *)0x0) {
        pBVar11->next = pBVar4->next;
        pBVar6 = pBVar4;
      }
      pBVar6->next = pBVar11;
      *(Block **)(this + 0x40) = pBVar11;
      *(long *)(this + 0x60) = *(long *)(this + 0x60) + 1;
    }
    else {
      pBVar11 = *(Block **)(*(long *)(this + 0x40) + 0x200);
      *(Block **)(this + 0x40) = pBVar11;
      Block::
      reset_empty<(duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
                (pBVar11);
      pBVar11 = *(Block **)(this + 0x40);
    }
    pBVar11->elements[8] = '\0';
    pBVar11->elements[9] = '\0';
    pBVar11->elements[10] = '\0';
    pBVar11->elements[0xb] = '\0';
    pBVar11->elements[0xc] = '\0';
    pBVar11->elements[0xd] = '\0';
    pBVar11->elements[0xe] = '\0';
    pBVar11->elements[0xf] = '\0';
    peVar7 = (element->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var8 = (element->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (element->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)pBVar11->elements = peVar7;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pBVar11->elements + 8) = p_Var8;
    (element->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    lVar3 = *(long *)(*(long *)(this + 0x58) + 0x10);
    lVar5 = *(long *)(this + 0x70);
    lVar12 = lVar5 * 0x10;
    *(ulong *)(lVar3 + lVar12) = uVar2;
    *(Block **)(lVar3 + 8 + lVar12) = pBVar11;
    *(long *)(*(long *)(this + 0x58) + 8) = lVar5;
    *(ulong *)(this + 0x70) = *(long *)(this + 0x68) - 1U & *(long *)(this + 0x70) + 1U;
  }
  else {
    lVar3 = *(long *)(this + 0x40);
    uVar10 = (ulong)(uint)((int)(uVar2 & 0x1f) << 4);
    *(undefined8 *)(lVar3 + 8 + uVar10) = 0;
    peVar7 = (element->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var8 = (element->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (element->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puVar1 = (undefined8 *)(lVar3 + uVar10);
    *puVar1 = peVar7;
    puVar1[1] = p_Var8;
    (element->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  *(ulong *)(this + 0x20) = uVar2 + 1;
  return true;
}

Assistant:

inline bool enqueue(U&& element)
		{
			index_t currentTailIndex = this->tailIndex.load(std::memory_order_relaxed);
			index_t newTailIndex = 1 + currentTailIndex;
			if ((currentTailIndex & static_cast<index_t>(BLOCK_SIZE - 1)) == 0) {
				// We reached the end of a block, start a new one
				auto startBlock = this->tailBlock;
				auto originalBlockIndexSlotsUsed = pr_blockIndexSlotsUsed;
				if (this->tailBlock != nullptr && this->tailBlock->next->ConcurrentQueue::Block::template is_empty<explicit_context>()) {
					// We can re-use the block ahead of us, it's empty!					
					this->tailBlock = this->tailBlock->next;
					this->tailBlock->ConcurrentQueue::Block::template reset_empty<explicit_context>();
					
					// We'll put the block on the block index (guaranteed to be room since we're conceptually removing the
					// last block from it first -- except instead of removing then adding, we can just overwrite).
					// Note that there must be a valid block index here, since even if allocation failed in the ctor,
					// it would have been re-attempted when adding the first block to the queue; since there is such
					// a block, a block index must have been successfully allocated.
				}
				else {
					// Whatever head value we see here is >= the last value we saw here (relatively),
					// and <= its current value. Since we have the most recent tail, the head must be
					// <= to it.
					auto head = this->headIndex.load(std::memory_order_relaxed);
					assert(!details::circular_less_than<index_t>(currentTailIndex, head));
					if (!details::circular_less_than<index_t>(head, currentTailIndex + BLOCK_SIZE)
						|| (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value && (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - BLOCK_SIZE < currentTailIndex - head))) {
						// We can't enqueue in another block because there's not enough leeway -- the
						// tail could surpass the head by the time the block fills up! (Or we'll exceed
						// the size limit, if the second part of the condition was true.)
						return false;
					}
					// We're going to need a new block; check that the block index has room
					if (pr_blockIndexRaw == nullptr || pr_blockIndexSlotsUsed == pr_blockIndexSize) {
						// Hmm, the circular block index is already full -- we'll need
						// to allocate a new index. Note pr_blockIndexRaw can only be nullptr if
						// the initial allocation failed in the constructor.
						
						MOODYCAMEL_CONSTEXPR_IF (allocMode == CannotAlloc) {
							return false;
						}
						else if (!new_block_index(pr_blockIndexSlotsUsed)) {
							return false;
						}
					}
					
					// Insert a new block in the circular linked list
					auto newBlock = this->parent->ConcurrentQueue::template requisition_block<allocMode>();
					if (newBlock == nullptr) {
						return false;
					}
#ifdef MCDBGQ_TRACKMEM
					newBlock->owner = this;
#endif
					newBlock->ConcurrentQueue::Block::template reset_empty<explicit_context>();
					if (this->tailBlock == nullptr) {
						newBlock->next = newBlock;
					}
					else {
						newBlock->next = this->tailBlock->next;
						this->tailBlock->next = newBlock;
					}
					this->tailBlock = newBlock;
					++pr_blockIndexSlotsUsed;
				}

				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new ((T*)nullptr) T(std::forward<U>(element)))) {
					// The constructor may throw. We want the element not to appear in the queue in
					// that case (without corrupting the queue):
					MOODYCAMEL_TRY {
						new ((*this->tailBlock)[currentTailIndex]) T(std::forward<U>(element));
					}
					MOODYCAMEL_CATCH (...) {
						// Revert change to the current block, but leave the new block available
						// for next time
						pr_blockIndexSlotsUsed = originalBlockIndexSlotsUsed;
						this->tailBlock = startBlock == nullptr ? this->tailBlock : startBlock;
						MOODYCAMEL_RETHROW;
					}
				}
				else {
					(void)startBlock;
					(void)originalBlockIndexSlotsUsed;
				}
				
				// Add block to block index
				auto& entry = blockIndex.load(std::memory_order_relaxed)->entries[pr_blockIndexFront];
				entry.base = currentTailIndex;
				entry.block = this->tailBlock;
				blockIndex.load(std::memory_order_relaxed)->front.store(pr_blockIndexFront, std::memory_order_release);
				pr_blockIndexFront = (pr_blockIndexFront + 1) & (pr_blockIndexSize - 1);
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new ((T*)nullptr) T(std::forward<U>(element)))) {
					this->tailIndex.store(newTailIndex, std::memory_order_release);
					return true;
				}
			}